

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.cpp
# Opt level: O0

string * __thiscall embree::StringStream::next_abi_cxx11_(StringStream *this)

{
  bool bVar1;
  int *piVar2;
  uint *puVar3;
  runtime_error *this_00;
  char *pcVar4;
  long in_RSI;
  string *in_RDI;
  int c;
  vector<char,_std::allocator<char>_> str;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  allocator *paVar5;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  char cVar6;
  undefined4 in_stack_fffffffffffffe2c;
  Stream<int> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  byte local_1b5;
  byte local_191;
  byte local_179;
  Stream<int> *in_stack_fffffffffffffe88;
  byte local_151;
  allocator local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  allocator local_131;
  string local_130 [64];
  string local_f0 [32];
  uint local_d0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  uint local_2c;
  uint local_1c;
  uint local_c;
  
  while( true ) {
    local_38 = in_RSI + 0x40;
    piVar2 = Stream<int>::peek(in_stack_fffffffffffffe88);
    if (*piVar2 == -1) break;
    bVar1 = std::operator!=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    if (bVar1) {
      local_40 = in_RSI + 0x40;
      piVar2 = Stream<int>::peek(in_stack_fffffffffffffe88);
      if (*piVar2 == 10) {
        local_48 = in_RSI + 0x40;
        Stream<int>::drop(in_stack_fffffffffffffe88);
        std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x248));
        return in_RDI;
      }
    }
    if ((*(byte *)(in_RSI + 0x268) & 1) == 0) {
LAB_00478b37:
      local_78 = in_RSI + 0x40;
      puVar3 = (uint *)Stream<int>::peek(in_stack_fffffffffffffe88);
      local_1c = *puVar3;
      local_151 = 0;
      if (local_1c < 0x100) {
        local_151 = *(byte *)(in_RSI + 0x48 + (ulong)local_1c);
      }
      if ((local_151 & 1) == 0) break;
      local_80 = in_RSI + 0x40;
      Stream<int>::drop(in_stack_fffffffffffffe88);
    }
    else {
      local_50 = in_RSI + 0x40;
      piVar2 = Stream<int>::peek(in_stack_fffffffffffffe88);
      if (*piVar2 != 0x5c) goto LAB_00478b37;
      local_58 = in_RSI + 0x40;
      Stream<int>::drop(in_stack_fffffffffffffe88);
      local_60 = in_RSI + 0x40;
      piVar2 = Stream<int>::peek(in_stack_fffffffffffffe88);
      if (*piVar2 != 10) {
        local_70 = in_RSI + 0x40;
        Stream<int>::unget(in_stack_fffffffffffffe30,
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        goto LAB_00478b37;
      }
      local_68 = in_RSI + 0x40;
      Stream<int>::drop(in_stack_fffffffffffffe88);
    }
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x478bff);
  std::vector<char,_std::allocator<char>_>::reserve
            (in_stack_fffffffffffffe40,CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38)
            );
  while( true ) {
    local_88 = in_RSI + 0x40;
    in_stack_fffffffffffffe88 = (Stream<int> *)Stream<int>::peek(in_stack_fffffffffffffe88);
    local_179 = 0;
    if (*(int *)&(in_stack_fffffffffffffe88->super_RefCount)._vptr_RefCount != -1) {
      local_90 = in_RSI + 0x40;
      puVar3 = (uint *)Stream<int>::peek(in_stack_fffffffffffffe88);
      local_2c = *puVar3;
      local_191 = 0;
      if (local_2c < 0x100) {
        local_191 = *(byte *)(in_RSI + 0x48 + (ulong)local_2c);
      }
      local_179 = local_191 ^ 0xff;
    }
    if ((local_179 & 1) == 0) break;
    local_98 = in_RSI + 0x40;
    local_d0 = Stream<int>::get(in_stack_fffffffffffffe88);
    local_1b5 = 0;
    if (local_d0 < 0x100) {
      local_1b5 = *(byte *)(in_RSI + 0x148 + (ulong)local_d0);
    }
    local_c = local_d0;
    if ((local_1b5 & 1) == 0) {
      local_132 = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      paVar5 = &local_131;
      cVar6 = (char)local_d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,1,cVar6,paVar5);
      std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::operator+(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
      std::runtime_error::runtime_error(this_00,local_f0);
      local_132 = 0;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_133 = (char)local_d0;
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08);
  }
  local_134 = 0;
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x478f95);
  paVar5 = &local_135;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar4,paVar5);
  std::allocator<char>::~allocator((allocator<char> *)&local_135);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffe20);
  return in_RDI;
}

Assistant:

std::string StringStream::next()
  {
    /* skip separators */
    while (cin->peek() != EOF) {
      if (endl != "" && cin->peek() == '\n') { cin->drop(); return endl; }
      if (multiLine && cin->peek() == '\\') {
        cin->drop();
        if (cin->peek() == '\n') { cin->drop(); continue; }
        cin->unget();
      }
      if (!isSeparator(cin->peek())) break;
      cin->drop();
    }

    /* parse everything until the next separator */
    std::vector<char> str; str.reserve(64);
    while (cin->peek() != EOF && !isSeparator(cin->peek())) {
      int c = cin->get();
      if (!isValidChar(c)) throw std::runtime_error("invalid character "+std::string(1,c)+" in input");
      str.push_back((char)c);
    }
    str.push_back(0);
    return std::string(str.data());
  }